

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  secp256k1_ge_storage_0_ *psVar1;
  
  memcpy(prealloc,ctx,
         (ulong)((ctx->ecmult_ctx).pre_g != (secp256k1_ge_storage_0_ *)0x0) << 0x13 | 0xe0);
  psVar1 = (ctx->ecmult_ctx).pre_g;
  if (psVar1 != (secp256k1_ge_storage_0_ *)0x0) {
    *(long *)prealloc = ((long)psVar1 - (long)ctx) + (long)prealloc;
  }
  return (secp256k1_context *)prealloc;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    size_t prealloc_size;
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);

    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)prealloc;
    memcpy(ret, ctx, prealloc_size);
    secp256k1_ecmult_gen_context_finalize_memcpy(&ret->ecmult_gen_ctx, &ctx->ecmult_gen_ctx);
    secp256k1_ecmult_context_finalize_memcpy(&ret->ecmult_ctx, &ctx->ecmult_ctx);
    return ret;
}